

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcodeEan8.cpp
# Opt level: O2

uint32_t BarcodeEan8::intToBarcode(uint32_t value,uint8_t *barcode)

{
  byte bVar1;
  ulong uVar2;
  char cVar5;
  uint uVar3;
  uint uVar4;
  ulong uVar6;
  ushort uVar7;
  ushort uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar7 = (ushort)(value / 1000000) % 10;
  uVar8 = (ushort)((ulong)value / 100000) % 10;
  uVar6 = ((ulong)value / 10000) % 10;
  uVar9 = ((ulong)value / 1000) % 10;
  uVar10 = ((ulong)value / 100) % 10;
  uVar11 = (ulong)value % 10;
  uVar2 = ((ulong)value / 10) % 10;
  cVar5 = (char)((((short)uVar10 + (short)uVar11 + (short)uVar6 + uVar7) * 3 +
                  (short)uVar2 + (short)uVar9 + uVar8 & 0xff) % 10);
  uVar3 = (uint)(byte)(10 - cVar5);
  if (cVar5 == '\0') {
    uVar3 = 0;
  }
  uVar4 = (uint)"\r\x19\x13=#1/;7\v"[uVar8] << 7 | (uint)"\r\x19\x13=#1/;7\v"[uVar7] << 0xe;
  bVar1 = "\r\x19\x13=#1/;7\v"[uVar9];
  uVar12 = (ulong)"rflB\\NPDHt"[uVar10] | (ulong)bVar1 << 0xc |
           ((ulong)"\r\x19\x13=#1/;7\v"[uVar6] | (ulong)uVar4) << 0x13;
  uVar6 = (ulong)"rflB\\NPDHt"[uVar11] | (ulong)"rflB\\NPDHt"[uVar2] << 7;
  uVar11 = uVar12 << 0xe | uVar6;
  uVar10 = (ulong)"rflB\\NPDHt"[uVar3] | uVar11 << 7;
  uVar9 = uVar10 | 0xa0000000a0000000;
  *barcode = (uint8_t)(uVar9 >> 0x38);
  barcode[1] = (uint8_t)(uVar4 >> 8);
  barcode[2] = (uint8_t)(uVar12 >> 0x13);
  barcode[3] = bVar1 * '\x02';
  barcode[4] = (uint8_t)(uVar9 >> 0x18);
  barcode[5] = (uint8_t)(uVar11 >> 9);
  barcode[6] = (uint8_t)(uVar6 >> 1);
  barcode[7] = (uint8_t)uVar10;
  barcode[8] = 0xa0;
  return 0x43;
}

Assistant:

uint32_t BarcodeEan8::intToBarcode(const uint32_t value, uint8_t barcode[9])
{
   uint8_t digit[8];
   uint32_t oddDigits;
   uint32_t evenDigits;
   uint32_t remainder;
   uint64_t helper;

   //get 7 decimal digits
   digit[0] = (value / (1000000uL)) % 10;
   digit[1] = (value / (100000uL)) % 10;
   digit[2] = (value / (10000uL)) % 10;
   digit[3] = (value / (1000uL)) % 10;
   digit[4] = (value / (100uL)) % 10;
   digit[5] = (value / (10uL)) % 10;
   digit[6] = value % 10;

   //checksum digit
   oddDigits = digit[6] + digit[4] + digit[2] + digit[0];
   evenDigits = digit[5] + digit[3] + digit[1];
   remainder = ((3 * oddDigits + evenDigits) % 10);
   digit[7] = (uint8_t)((10 - remainder) % 10);

   //encode into barcode

   //use 64-bit helper variable
   //start marker
   helper = 0x05; //3bit
   //left digits
   helper = (helper << 7) | leftOddDigit[digit[0]];
   helper = (helper << 7) | leftOddDigit[digit[1]];
   helper = (helper << 7) | leftOddDigit[digit[2]];
   helper = (helper << 7) | leftOddDigit[digit[3]];
   //center marker
   helper = (helper << 5) | 0x0A; //5bit
   //right digits
   helper = (helper << 7) | rightDigit[digit[4]];
   helper = (helper << 7) | rightDigit[digit[5]];
   helper = (helper << 7) | rightDigit[digit[6]];
   helper = (helper << 7) | rightDigit[digit[7]];

   //copy into byte array
   barcode[0] = (uint8_t)(helper >> 56);
   barcode[1] = (uint8_t)(helper >> 48);
   barcode[2] = (uint8_t)(helper >> 40);
   barcode[3] = (uint8_t)(helper >> 32);
   barcode[4] = (uint8_t)(helper >> 24);
   barcode[5] = (uint8_t)(helper >> 16);
   barcode[6] = (uint8_t)(helper >> 8);
   barcode[7] = (uint8_t)helper;
   barcode[8] = 0x05 << 5; //add end marker


   //return length of barcode
   return (3 + 4*7 + 5 + 4*7 + 3); //3bit start, four 7-bit digits, 5 bit middle, 4 7-bit digits, 3bit end
}